

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test<nrg::AsyncExecutor<nrg::TimedExecution>>(void)

{
  Executor<nrg::AsyncExecutor<nrg::TimedExecution>_> ex;
  Function f;
  Executor<nrg::AsyncExecutor<nrg::TimedExecution>_> local_68;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_58;
  int local_4c;
  function<void_()> local_48;
  ExceptionHandler local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = onError;
  local_28._M_invoker =
       std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
       _M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
       _M_manager;
  nrg::Executor<nrg::AsyncExecutor<nrg::TimedExecution>_>::Executor(&local_68,&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_object = noParam;
  local_48._M_invoker = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_48.super__Function_base._M_manager = std::_Function_handler<void_(),_void_(*)()>::_M_manager
  ;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_68.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&local_48);
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_68.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,noParam);
  local_58._M_data._0_4_ = 0x2a;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_68.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,(int *)&local_58,(char (*) [6])"hallo");
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_68.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,exception);
  local_58._M_data = (basic_ostream<char,_std::char_traits<char>_> *)&std::cerr;
  local_4c = 0x19;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_68.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,&local_58,&local_4c);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if (local_68.executor_.impl_.
      super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.executor_.impl_.
               super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void test()
{
    nrg::Executor<ExecutionMode> ex(onError);
    typename ExecutionMode::Function f = noParam;
    ex(f);

    ex(noParam);
    ex(print2, 42, "hallo");
    ex(exception);

    ex(print<int>, std::ref(std::cerr), 25);
}